

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

Ref<anurbs::Brep> __thiscall
anurbs::Model::add<anurbs::Brep>(Model *this,Pointer<anurbs::Brep> *data,string *attributes)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Brep> RVar1;
  input_adapter iStack_88;
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_78;
  Ref<anurbs::Brep> local_68;
  __shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2> local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  std::__shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,(__shared_ptr<anurbs::Brep,_(__gnu_cxx::_Lock_policy)2> *)attributes);
  add<anurbs::Brep>(this,data);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  Ref<anurbs::Brep>::attributes(&local_68);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&iStack_88,in_RCX);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&local_78,&iStack_88,(parser_callback_t *)&local_48,true);
  Attributes::
  load<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
            ((Attributes *)
             local_68.m_entry.
             super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (Model *)data,&local_78);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&iStack_88.ia.
              super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.m_entry.
              super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ref<anurbs::Brep>)
         RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Brep>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<TData> add(Pointer<TData> data, const std::string& attributes)
    {
        const auto ref = add(data);

        ref.attributes()->load(*this, Json::parse(attributes));

        return ref;
    }